

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O0

int __thiscall gdsForge::GDSwriteInt(gdsForge *this,int record,int *arrInt,int cnt)

{
  FILE *__s;
  long lVar1;
  undefined1 *__ptr;
  ostream *poVar2;
  int iVar3;
  ulong __n;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  undefined1 *local_60;
  gdsForge *local_58;
  uchar local_50 [4];
  int local_4c;
  uint j;
  int i;
  unsigned_long __vla_expr0;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined4 local_34;
  uchar OHout [4];
  uint sizeByte;
  uint dataSize;
  int cnt_local;
  int *arrInt_local;
  int record_local;
  gdsForge *this_local;
  
  OHout = (uchar  [4])(record & 0xff);
  local_58 = this;
  if ((OHout == (uchar  [4])0x2) && (0 < cnt)) {
    OHout[0] = '\x02';
    OHout[1] = '\0';
    OHout[2] = '\0';
    OHout[3] = '\0';
  }
  else if ((OHout == (uchar  [4])0x3) && (0 < cnt)) {
    OHout[0] = '\x04';
    OHout[1] = '\0';
    OHout[2] = '\0';
    OHout[3] = '\0';
  }
  else {
    if ((OHout != (uchar  [4])0x0) || (cnt != 0)) {
      uStack_70 = 0x123c9e;
      poVar2 = std::operator<<((ostream *)&std::cout,"Incorrect parameters for record: 0x");
      uStack_70 = 0x123cad;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
      uStack_70 = 0x123cb8;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,record);
      uStack_70 = 0x123cc7;
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      uStack_70 = 0x123cda;
      std::ostream::operator<<((ostream *)&std::cout,std::dec);
      return 1;
    }
    OHout[0] = '\0';
    OHout[1] = '\0';
    OHout[2] = '\0';
    OHout[3] = '\0';
  }
  iVar3 = cnt * (int)OHout + 4;
  local_34._1_1_ = (undefined1)((uint)iVar3 >> 8);
  local_38 = local_34._1_1_;
  local_34._0_1_ = (undefined1)iVar3;
  local_37 = (undefined1)local_34;
  arrInt_local._5_1_ = (undefined1)((uint)record >> 8);
  local_36 = arrInt_local._5_1_;
  arrInt_local._4_1_ = (undefined1)record;
  local_35 = arrInt_local._4_1_;
  uStack_70 = 0x123d2c;
  local_34 = iVar3;
  fwrite(&local_38,1,4,(FILE *)this->gdsFile);
  _j = (ulong)(uint)OHout;
  lVar1 = -(_j + 0xf & 0xfffffffffffffff0);
  local_60 = auStack_68 + lVar1;
  __vla_expr0 = (unsigned_long)auStack_68;
  for (local_4c = 0; __ptr = local_60, local_4c < cnt; local_4c = local_4c + 1) {
    local_50[0] = '\0';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    for (; (uint)local_50 < (uint)OHout; local_50 = (uchar  [4])((int)local_50 + 1)) {
      local_60[(uint)local_50] =
           (char)(arrInt[local_4c] >> ((OHout[0] + 0xff) * '\b' - (char)((int)local_50 << 3) & 0x1f)
                 );
    }
    __n = (ulong)(uint)OHout;
    __s = (FILE *)local_58->gdsFile;
    *(undefined8 *)(auStack_68 + lVar1 + -8) = 0x123dc8;
    fwrite(__ptr,1,__n,__s);
  }
  return 0;
}

Assistant:

int gdsForge::GDSwriteInt(int record, int arrInt[], int cnt)
{
  unsigned int dataSize = record & 0xff;

  if (dataSize == 0x02 && cnt > 0) {
    dataSize = 2; // should/could be omitted
  } else if (dataSize == 0x03 && cnt > 0) {
    dataSize = 4;
  } else if (dataSize == 0x00 && cnt == 0) {
    dataSize = 0; // should/could be omitted
  } else {
    cout << "Incorrect parameters for record: 0x" << hex << record << endl;
    cout << dec;
    return 1;
  }

  unsigned int sizeByte = cnt * dataSize + 4;
  unsigned char OHout[4];

  OHout[0] = sizeByte >> 8 & 0xff;
  OHout[1] = sizeByte & 0xff;
  OHout[2] = record >> 8 & 0xff;
  OHout[3] = record & 0xff;
  fwrite(OHout, 1, 4, this->gdsFile);

  unsigned char dataOut[dataSize];

  for (int i = 0; i < cnt; i++) {
    for (unsigned int j = 0; j < dataSize; j++) {
      dataOut[j] = arrInt[i] >> (((dataSize - 1) * 8) - (j * 8)) & 0xff;
    }
    fwrite(dataOut, 1, dataSize, this->gdsFile);
  }

  return 0;
}